

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi.cpp
# Opt level: O0

Msgs * __thiscall curlpp::Multi::info_abi_cxx11_(Multi *this)

{
  list<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
  *this_00;
  undefined8 *in_RSI;
  Msgs *in_RDI;
  pair<const_curlpp::Easy_*,_curlpp::Multi::Info> pVar1;
  Info inf;
  int msgsInQueue;
  CURLMsg *msg;
  Msgs *result;
  Info *in_stack_ffffffffffffff78;
  Info in_stack_ffffffffffffff80;
  Info __x;
  Easy *in_stack_ffffffffffffff88;
  Easy *in_stack_ffffffffffffffb8;
  Info in_stack_ffffffffffffffc0;
  pair<const_curlpp::Easy_*,_curlpp::Multi::Info> pVar2;
  undefined1 local_1c [4];
  long local_18;
  
  std::__cxx11::
  list<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
  ::list((list<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
          *)0x149315);
  pVar2.second = in_stack_ffffffffffffffc0;
  pVar2.first = in_stack_ffffffffffffffb8;
  pVar1.second = in_stack_ffffffffffffff80;
  pVar1.first = in_stack_ffffffffffffff88;
  while( true ) {
    local_18 = curl_multi_info_read(*in_RSI,local_1c);
    __x = pVar1.second;
    if (local_18 == 0) break;
    this_00 = (list<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
               *)std::
                 map<void_*,_const_curlpp::Easy_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_const_curlpp::Easy_*>_>_>
                 ::operator[]((map<void_*,_const_curlpp::Easy_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_const_curlpp::Easy_*>_>_>
                               *)pVar2.second,&(pVar2.first)->_vptr_Easy);
    pVar1 = std::make_pair<curlpp::Easy_const*&,curlpp::Multi::Info&>
                      ((Easy **)__x,in_stack_ffffffffffffff78);
    pVar2 = pVar1;
    std::__cxx11::
    list<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
    ::push_back(this_00,(value_type *)pVar1.first);
  }
  return in_RDI;
}

Assistant:

curlpp::Multi::Msgs
curlpp::Multi::info()
{
  CURLMsg * msg; /* for picking up messages with the transfer status */
  
  int msgsInQueue;
  Msgs result;
  while ((msg = curl_multi_info_read(mMultiHandle, &msgsInQueue)) != NULL) {
    Multi::Info inf;
    inf.msg = msg->msg;
    inf.code = msg->data.result;
    result.push_back(std::make_pair(mHandles[msg->easy_handle],inf));
  }

  return result;
}